

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw1.c
# Opt level: O0

uint32_t crc32c(void *buf,size_t len,uint32_t crc)

{
  uint32_t uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  uint in_EDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  uint64_t crc2;
  uint64_t crc1;
  uint64_t crc0;
  uchar *end;
  uchar *next;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  undefined8 *local_20;
  ulong local_10;
  
  pthread_once(&crc32c_once_hw,crc32c_init_hw);
  local_30 = (ulong)(in_EDX ^ 0xffffffff);
  local_20 = in_RDI;
  for (local_10 = in_RSI; local_10 != 0 && ((ulong)local_20 & 7) != 0; local_10 = local_10 - 1) {
    local_30 = crc32(local_30,*(undefined1 *)local_20);
    local_20 = (undefined8 *)((long)local_20 + 1);
  }
  for (; 0x5fff < local_10; local_10 = local_10 - 0x6000) {
    local_38 = 0;
    local_40 = 0;
    puVar2 = local_20 + 0x400;
    puVar3 = local_20;
    do {
      local_20 = puVar3;
      local_30 = crc32(local_30,*local_20);
      local_38 = crc32(local_38,local_20[0x400]);
      local_40 = crc32(local_40,local_20[0x800]);
      puVar3 = local_20 + 1;
    } while (local_20 + 1 < puVar2);
    uVar1 = crc32c_shift(crc32c_long,(uint32_t)local_30);
    uVar1 = crc32c_shift(crc32c_long,uVar1 ^ (uint)local_38);
    local_30 = uVar1 ^ local_40;
    local_20 = local_20 + 0x801;
  }
  for (; 0x2ff < local_10; local_10 = local_10 - 0x300) {
    local_38 = 0;
    local_40 = 0;
    puVar2 = local_20 + 0x20;
    puVar3 = local_20;
    do {
      local_20 = puVar3;
      local_30 = crc32(local_30,*local_20);
      local_38 = crc32(local_38,local_20[0x20]);
      local_40 = crc32(local_40,local_20[0x40]);
      puVar3 = local_20 + 1;
    } while (local_20 + 1 < puVar2);
    uVar1 = crc32c_shift(crc32c_short,(uint32_t)local_30);
    uVar1 = crc32c_shift(crc32c_short,uVar1 ^ (uint)local_38);
    local_30 = uVar1 ^ local_40;
    local_20 = local_20 + 0x41;
  }
  puVar3 = (undefined8 *)((long)local_20 + (local_10 - (local_10 & 7)));
  for (; local_20 < puVar3; local_20 = local_20 + 1) {
    local_30 = crc32(local_30,*local_20);
  }
  for (local_10 = local_10 & 7; local_10 != 0; local_10 = local_10 - 1) {
    local_30 = crc32(local_30,*(undefined1 *)local_20);
    local_20 = (undefined8 *)((long)local_20 + 1);
  }
  return (uint)local_30 ^ 0xffffffff;
}

Assistant:

uint32_t crc32c(const void *buf, size_t len, uint32_t crc)
{
    const unsigned char *next = buf;
    const unsigned char *end;
    uint64_t crc0, crc1, crc2;      /* need to be 64 bits for crc32q */

    /* populate shift tables the first time through */
    pthread_once(&crc32c_once_hw, crc32c_init_hw);

    /* pre-process the crc */
    crc0 = crc ^ 0xffffffff;

    /* compute the crc for up to seven leading bytes to bring the data pointer
       to an eight-byte boundary */
    while (len && ((uintptr_t)next & 7) != 0) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* compute the crc on sets of LONG*3 bytes, executing three independent crc
       instructions, each on LONG bytes -- this is optimized for the Nehalem,
       Westmere, Sandy Bridge, and Ivy Bridge architectures, which have a
       throughput of one crc per cycle, but a latency of three cycles */
    while (len >= LONG*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + LONG;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" LONGx1 "(%3), %1\n\t"
                    "crc32q\t" LONGx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_long, crc0) ^ crc2;
        next += LONG*2;
        len -= LONG*3;
    }

    /* do the same thing, but now on SHORT*3 blocks for the remaining data less
       than a LONG*3 block */
    while (len >= SHORT*3) {
        crc1 = 0;
        crc2 = 0;
        end = next + SHORT;
        do {
            __asm__("crc32q\t" "(%3), %0\n\t"
                    "crc32q\t" SHORTx1 "(%3), %1\n\t"
                    "crc32q\t" SHORTx2 "(%3), %2"
                    : "=r"(crc0), "=r"(crc1), "=r"(crc2)
                    : "r"(next), "0"(crc0), "1"(crc1), "2"(crc2));
            next += 8;
        } while (next < end);
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc1;
        crc0 = crc32c_shift(crc32c_short, crc0) ^ crc2;
        next += SHORT*2;
        len -= SHORT*3;
    }

    /* compute the crc on the remaining eight-byte units less than a SHORT*3
       block */
    end = next + (len - (len & 7));
    while (next < end) {
        __asm__("crc32q\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next += 8;
    }
    len &= 7;

    /* compute the crc for up to seven trailing bytes */
    while (len) {
        __asm__("crc32b\t" "(%1), %0"
                : "=r"(crc0)
                : "r"(next), "0"(crc0));
        next++;
        len--;
    }

    /* return a post-processed crc */
    return (uint32_t)(crc0 ^ 0xffffffff);
}